

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

void __thiscall QSplitterPrivate::storeSizes(QSplitterPrivate *this)

{
  Orientation OVar1;
  long lVar2;
  QSplitterLayoutStruct **ppQVar3;
  QSplitterLayoutStruct *pQVar4;
  long lVar5;
  int iVar6;
  
  lVar2 = (this->list).d.size;
  if (lVar2 != 0) {
    ppQVar3 = (this->list).d.ptr;
    OVar1 = this->orient;
    lVar5 = 0;
    do {
      pQVar4 = ppQVar3[lVar5];
      iVar6 = (pQVar4->rect).y2.m_i - (pQVar4->rect).y1.m_i;
      if (OVar1 == Horizontal) {
        iVar6 = (pQVar4->rect).x2.m_i - (pQVar4->rect).x1.m_i;
      }
      pQVar4->sizer = iVar6 + 1;
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  return;
}

Assistant:

void QSplitterPrivate::storeSizes()
{
    for (int i = 0; i < list.size(); ++i) {
        QSplitterLayoutStruct *sls = list.at(i);
        sls->sizer = pick(sls->rect.size());
    }
}